

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# auto_map.cpp
# Opt level: O0

void __thiscall
CDoodadsMapper::Proceed(CDoodadsMapper *this,CLayerTiles *pLayer,int ConfigID,int Amount)

{
  int iVar1;
  int iVar2;
  CRuleSet *pCVar3;
  CRule *pCVar4;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  CRule *pRule;
  int i_1;
  int i;
  int MaxIndex;
  CRuleSet *pConf;
  int in_stack_00000070;
  int in_stack_00000074;
  array<array<int,_allocator_default<int>_>,_allocator_default<array<int,_allocator_default<int>_>_>_>
  *in_stack_00000078;
  CRule *in_stack_00000080;
  CLayerTiles *in_stack_00000088;
  CDoodadsMapper *in_stack_00000090;
  int local_2c;
  int local_28;
  
  if ((((*(byte *)(in_RSI + 0x24) & 1) == 0) && (-1 < in_EDX)) &&
     (iVar2 = array<CDoodadsMapper::CRuleSet,_allocator_default<CDoodadsMapper::CRuleSet>_>::size
                        ((array<CDoodadsMapper::CRuleSet,_allocator_default<CDoodadsMapper::CRuleSet>_>
                          *)(in_RDI + 0x18)), in_EDX < iVar2)) {
    AnalyzeGameLayer((CDoodadsMapper *)in_stack_00000088);
    pCVar3 = array<CDoodadsMapper::CRuleSet,_allocator_default<CDoodadsMapper::CRuleSet>_>::
             operator[]((array<CDoodadsMapper::CRuleSet,_allocator_default<CDoodadsMapper::CRuleSet>_>
                         *)(in_RDI + 0x18),in_EDX);
    iVar2 = array<CDoodadsMapper::CRule,_allocator_default<CDoodadsMapper::CRule>_>::size
                      (&pCVar3->m_aRules);
    if (iVar2 != 0) {
      iVar2 = *(int *)(in_RSI + 0x34);
      iVar1 = *(int *)(in_RSI + 0x38);
      for (local_28 = 0; local_28 < iVar2 * iVar1; local_28 = local_28 + 1) {
        *(undefined1 *)(*(long *)(in_RSI + 0x68) + (long)local_28 * 4) = 0;
        *(undefined1 *)(*(long *)(in_RSI + 0x68) + 1 + (long)local_28 * 4) = 0;
      }
      for (local_2c = 0;
          iVar2 = array<CDoodadsMapper::CRule,_allocator_default<CDoodadsMapper::CRule>_>::size
                            (&pCVar3->m_aRules), local_2c < iVar2; local_2c = local_2c + 1) {
        pCVar4 = array<CDoodadsMapper::CRule,_allocator_default<CDoodadsMapper::CRule>_>::operator[]
                           (&pCVar3->m_aRules,local_2c);
        if ((pCVar4->m_Location == 0) &&
           (iVar2 = array<array<int,_allocator_default<int>_>,_allocator_default<array<int,_allocator_default<int>_>_>_>
                    ::size((array<array<int,_allocator_default<int>_>,_allocator_default<array<int,_allocator_default<int>_>_>_>
                            *)(in_RDI + 0x28)), 0 < iVar2)) {
          PlaceDoodads(in_stack_00000090,in_stack_00000088,in_stack_00000080,in_stack_00000078,
                       in_stack_00000074,in_stack_00000070);
        }
        if ((pCVar4->m_Location == 1) &&
           (iVar2 = array<array<int,_allocator_default<int>_>,_allocator_default<array<int,_allocator_default<int>_>_>_>
                    ::size((array<array<int,_allocator_default<int>_>,_allocator_default<array<int,_allocator_default<int>_>_>_>
                            *)(in_RDI + 0x38)), 0 < iVar2)) {
          PlaceDoodads(in_stack_00000090,in_stack_00000088,in_stack_00000080,in_stack_00000078,
                       in_stack_00000074,in_stack_00000070);
        }
        if ((pCVar4->m_Location == 2) &&
           (iVar2 = array<array<int,_allocator_default<int>_>,_allocator_default<array<int,_allocator_default<int>_>_>_>
                    ::size((array<array<int,_allocator_default<int>_>,_allocator_default<array<int,_allocator_default<int>_>_>_>
                            *)(in_RDI + 0x48)), 0 < iVar2)) {
          PlaceDoodads(in_stack_00000090,in_stack_00000088,in_stack_00000080,in_stack_00000078,
                       in_stack_00000074,in_stack_00000070);
        }
        if ((pCVar4->m_Location == 2) &&
           (iVar2 = array<array<int,_allocator_default<int>_>,_allocator_default<array<int,_allocator_default<int>_>_>_>
                    ::size((array<array<int,_allocator_default<int>_>,_allocator_default<array<int,_allocator_default<int>_>_>_>
                            *)(in_RDI + 0x58)), 0 < iVar2)) {
          PlaceDoodads(in_stack_00000090,in_stack_00000088,in_stack_00000080,in_stack_00000078,
                       in_stack_00000074,in_stack_00000070);
        }
      }
      *(undefined1 *)(*(long *)(in_RDI + 8) + 0x1248) = 1;
    }
  }
  return;
}

Assistant:

void CDoodadsMapper::Proceed(CLayerTiles *pLayer, int ConfigID, int Amount)
{
	if(pLayer->m_Readonly || ConfigID < 0 || ConfigID >= m_aRuleSets.size())
		return;

	AnalyzeGameLayer();

	CRuleSet *pConf = &m_aRuleSets[ConfigID];

	if(!pConf->m_aRules.size())
		return;

	int MaxIndex = pLayer->m_Width*pLayer->m_Height;

	// clear tiles
	for(int i = 0 ; i < MaxIndex; i++)
	{
		pLayer->m_pTiles[i].m_Index = 0;
		pLayer->m_pTiles[i].m_Flags = 0;
	}

	// place doodads
	for(int i = 0 ; i < pConf->m_aRules.size(); i++)
	{
		CRule *pRule = &pConf->m_aRules[i];

		// floors
		if(pRule->m_Location == CRule::FLOOR && m_FloorIDs.size() > 0)
		{
			PlaceDoodads(pLayer, pRule, &m_FloorIDs, Amount);
		}

		// ceilings
		if(pRule->m_Location == CRule::CEILING && m_CeilingIDs.size() > 0)
		{
			PlaceDoodads(pLayer, pRule, &m_CeilingIDs, Amount);
		}

		// right walls
		if(pRule->m_Location == CRule::WALLS && m_RightWallIDs.size() > 0)
		{
			PlaceDoodads(pLayer, pRule, &m_RightWallIDs, Amount);
		}

		// left walls
		if(pRule->m_Location == CRule::WALLS && m_LeftWallIDs.size() > 0)
		{
			PlaceDoodads(pLayer, pRule, &m_LeftWallIDs, Amount, 1);
		}
	}

	m_pEditor->m_Map.m_Modified = true;
}